

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue JS_ReadArray(BCReaderState *s,int tag)

{
  JSContext *ctx;
  JSShape *sh;
  int iVar1;
  JSValueUnion p_00;
  JSValueUnion JVar2;
  JSRefCountHeader *p;
  int64_t iVar3;
  JSValueUnion JVar4;
  bool bVar5;
  JSValue this_obj;
  JSValue JVar6;
  JSValue prop;
  uint32_t len;
  uint local_4c;
  JSValue local_48;
  void *local_38;
  
  ctx = s->ctx;
  sh = ctx->array_shape;
  (sh->header).ref_count = (sh->header).ref_count + 1;
  this_obj = JS_NewObjectFromShape(ctx,sh,2);
  p_00 = this_obj.u;
  iVar1 = BC_add_object_ref1(s,(JSObject *)p_00.ptr);
  if ((iVar1 == 0) && (iVar1 = bc_get_leb128(s,&local_4c), iVar1 == 0)) {
    local_38 = (void *)(ulong)local_4c;
    if (local_38 != (void *)0x0) {
      JVar4.float64 = 0.0;
      do {
        JVar6 = JS_ReadObjectRec(s);
        if ((int)JVar6.tag == 6) goto LAB_0013c51c;
        bVar5 = -1 < JVar4.int32;
        JVar2.float64 = (double)((ulong)JVar4.ptr & 0xffffffff);
        if (bVar5) {
          JVar2 = JVar4;
        }
        iVar3 = 7;
        if (bVar5) {
          iVar3 = 0;
        }
        if (tag == 0xd) {
          iVar1 = 4;
        }
        else {
          iVar1 = 7;
        }
        prop.tag = iVar3;
        prop.u.float64 = JVar2.float64;
        local_48 = JVar6;
        iVar1 = JS_DefinePropertyValueValue(ctx,this_obj,prop,JVar6,iVar1);
        if (iVar1 < 0) goto LAB_0013c51c;
        JVar4.float64 = JVar4.float64 + 1;
      } while (local_38 != JVar4.ptr);
    }
    if (tag != 0xd) {
      return this_obj;
    }
    JVar6 = JS_ReadObjectRec(s);
    if (((int)JVar6.tag != 6) &&
       (((int)JVar6.tag == 3 ||
        (iVar1 = JS_DefinePropertyValue(ctx,this_obj,0x70,JVar6,0), -1 < iVar1)))) {
      JS_PreventExtensions(ctx,this_obj);
      return this_obj;
    }
  }
LAB_0013c51c:
  if ((0xfffffff4 < (uint)this_obj.tag) &&
     (iVar1 = *p_00.ptr, *(int *)p_00.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(ctx->rt,this_obj);
  }
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue JS_ReadArray(BCReaderState *s, int tag)
{
    JSContext *ctx = s->ctx;
    JSValue obj;
    uint32_t len, i;
    JSValue val;
    int ret, prop_flags;
    BOOL is_template;

    obj = JS_NewArray(ctx);
    if (BC_add_object_ref(s, obj))
        goto fail;
    is_template = (tag == BC_TAG_TEMPLATE_OBJECT);
    if (bc_get_leb128(s, &len))
        goto fail;
    for(i = 0; i < len; i++) {
        val = JS_ReadObjectRec(s);
        if (JS_IsException(val))
            goto fail;
        if (is_template)
            prop_flags = JS_PROP_ENUMERABLE;
        else
            prop_flags = JS_PROP_C_W_E;
        ret = JS_DefinePropertyValueUint32(ctx, obj, i, val,
                                           prop_flags);
        if (ret < 0)
            goto fail;
    }
    if (is_template) {
        val = JS_ReadObjectRec(s);
        if (JS_IsException(val))
            goto fail;
        if (!JS_IsUndefined(val)) {
            ret = JS_DefinePropertyValue(ctx, obj, JS_ATOM_raw, val, 0);
            if (ret < 0)
                goto fail;
        }
        JS_PreventExtensions(ctx, obj);
    }
    return obj;
 fail:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}